

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_conjunctive.cpp
# Opt level: O2

uint32_t sel_lt_int32_col_int32_val_branching
                   (uint32_t n,uint32_t *res_sel,int32_t *col,int32_t val,uint32_t *sel)

{
  uint uVar1;
  uint32_t i;
  ulong uVar2;
  ulong uVar3;
  
  if (sel == (uint32_t *)0x0) {
    uVar1 = 0;
    for (uVar2 = 0; n != uVar2; uVar2 = uVar2 + 1) {
      if (col[uVar2] < val) {
        uVar3 = (ulong)uVar1;
        uVar1 = uVar1 + 1;
        res_sel[uVar3] = (uint32_t)uVar2;
      }
    }
  }
  else {
    uVar1 = 0;
    for (uVar2 = 0; n != uVar2; uVar2 = uVar2 + 1) {
      if (col[sel[uVar2]] < val) {
        uVar3 = (ulong)uVar1;
        uVar1 = uVar1 + 1;
        res_sel[uVar3] = sel[uVar2];
      }
    }
  }
  return uVar1;
}

Assistant:

static uint32_t sel_lt_int32_col_int32_val_branching(uint32_t n,
                                                     uint32_t *res_sel,
                                                     int32_t *col,
                                                     int32_t val,
                                                     uint32_t *sel) {
    uint32_t res = 0;

    if (sel != nullptr) {
        for (uint32_t i = 0; i < n; i++) {
            if (col[sel[i]] < val)
                res_sel[res++] = sel[i];
        }
    }
    else {
        for (uint32_t i = 0; i < n; i++) {
            if (col[i] < val)
                res_sel[res++] = i;
        }
    }

    return res;
}